

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOutputRequiredFilesCommand.cxx
# Opt level: O0

void __thiscall cmLBDepend::DependWalk(cmLBDepend *this,cmDependInformation *info)

{
  byte bVar1;
  bool bVar2;
  char *pcVar3;
  long lVar4;
  undefined8 uVar5;
  reference pbVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_558;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_538;
  undefined1 local_518 [8];
  string path_3;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_4f0;
  iterator i_3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a8;
  undefined1 local_488 [8];
  string path_2;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_460;
  iterator i_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_438;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_418;
  undefined1 local_3f8 [8];
  string path_1;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_3d0;
  iterator i_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_388;
  undefined1 local_368 [8];
  string path;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_340;
  iterator i;
  undefined1 local_330 [7];
  bool found;
  undefined1 local_310 [8];
  string root;
  size_type pos;
  string cxxFile;
  string local_2c0 [8];
  string message;
  string includeFile;
  size_t qend;
  size_t qstart;
  string currentline;
  string line;
  long local_220;
  ifstream fin;
  cmDependInformation *info_local;
  cmLBDepend *this_local;
  
  pcVar3 = (char *)std::__cxx11::string::c_str();
  std::ifstream::ifstream(&local_220,pcVar3,_S_in);
  bVar1 = std::ios::operator!((ios *)((long)&local_220 + *(long *)(local_220 + -0x18)));
  if ((bVar1 & 1) == 0) {
    std::__cxx11::string::string((string *)(currentline.field_2._M_local_buf + 8));
    while (bVar2 = cmsys::SystemTools::GetLineFromStream
                             ((istream *)&local_220,(string *)((long)&currentline.field_2 + 8),
                              (bool *)0x0,-1), bVar2) {
      pcVar3 = (char *)std::__cxx11::string::c_str();
      bVar2 = cmHasLiteralPrefix<char_const*,9ul>(pcVar3,(char (*) [9])"#include");
      if (bVar2) {
        std::__cxx11::string::string
                  ((string *)&qstart,(string *)(currentline.field_2._M_local_buf + 8));
        lVar4 = std::__cxx11::string::find((char)&qstart,0x22);
        if (lVar4 == -1) {
          lVar4 = std::__cxx11::string::find((char)&qstart,0x3c);
          if (lVar4 != -1) {
            std::__cxx11::string::find((char)&qstart,0x3e);
            goto LAB_006e6759;
          }
          pcVar3 = (char *)std::__cxx11::string::c_str();
          cmSystemTools::Error("unknown include directive ",pcVar3,(char *)0x0,(char *)0x0);
        }
        else {
          std::__cxx11::string::find((char)&qstart,0x22);
LAB_006e6759:
          std::__cxx11::string::substr((ulong)((long)&message.field_2 + 8),(ulong)&qstart);
          bVar2 = cmsys::RegularExpression::find
                            (&(this->super_cmMakeDepend).IncludeFileRegularExpression,
                             (string *)((long)&message.field_2 + 8));
          if (bVar2) {
            uVar5 = std::__cxx11::string::c_str();
            (*(this->super_cmMakeDepend)._vptr_cmMakeDepend[5])(this,info,uVar5);
            std::__cxx11::string::string
                      ((string *)&pos,(string *)(message.field_2._M_local_buf + 8));
            root.field_2._8_8_ = std::__cxx11::string::rfind((char)&pos,0x2e);
            if (root.field_2._8_8_ != -1) {
              std::__cxx11::string::substr((ulong)local_310,(ulong)&pos);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_330,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_310,".cxx");
              std::__cxx11::string::operator=((string *)&pos,(string *)local_330);
              std::__cxx11::string::~string((string *)local_330);
              i._M_current._7_1_ = 0;
              pcVar3 = (char *)std::__cxx11::string::c_str();
              bVar2 = cmsys::SystemTools::FileExists(pcVar3);
              if (bVar2) {
                i._M_current._7_1_ = 1;
              }
              local_340._M_current =
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::begin(&(this->super_cmMakeDepend).IncludeDirectories);
              while( true ) {
                path.field_2._8_8_ =
                     std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::end(&(this->super_cmMakeDepend).IncludeDirectories);
                bVar2 = __gnu_cxx::operator!=
                                  (&local_340,
                                   (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    *)((long)&path.field_2 + 8));
                if (!bVar2) break;
                pbVar6 = __gnu_cxx::
                         __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         ::operator*(&local_340);
                std::__cxx11::string::string((string *)local_368,(string *)pbVar6);
                std::operator+(&local_388,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_368,"/");
                std::__cxx11::string::operator=((string *)local_368,(string *)&local_388);
                std::__cxx11::string::~string((string *)&local_388);
                std::operator+(&local_3a8,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_368,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &pos);
                std::__cxx11::string::operator=((string *)local_368,(string *)&local_3a8);
                std::__cxx11::string::~string((string *)&local_3a8);
                pcVar3 = (char *)std::__cxx11::string::c_str();
                bVar2 = cmsys::SystemTools::FileExists(pcVar3);
                if (bVar2) {
                  i._M_current._7_1_ = 1;
                }
                std::__cxx11::string::~string((string *)local_368);
                __gnu_cxx::
                __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator++(&local_340);
              }
              if ((i._M_current._7_1_ & 1) == 0) {
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &i_1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_310,".cpp");
                std::__cxx11::string::operator=((string *)&pos,(string *)&i_1);
                std::__cxx11::string::~string((string *)&i_1);
                pcVar3 = (char *)std::__cxx11::string::c_str();
                bVar2 = cmsys::SystemTools::FileExists(pcVar3);
                if (bVar2) {
                  i._M_current._7_1_ = 1;
                }
                local_3d0._M_current =
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::begin(&(this->super_cmMakeDepend).IncludeDirectories);
                while( true ) {
                  path_1.field_2._8_8_ =
                       std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::end(&(this->super_cmMakeDepend).IncludeDirectories);
                  bVar2 = __gnu_cxx::operator!=
                                    (&local_3d0,
                                     (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                      *)((long)&path_1.field_2 + 8));
                  if (!bVar2) break;
                  pbVar6 = __gnu_cxx::
                           __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           ::operator*(&local_3d0);
                  std::__cxx11::string::string((string *)local_3f8,(string *)pbVar6);
                  std::operator+(&local_418,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_3f8,"/");
                  std::__cxx11::string::operator=((string *)local_3f8,(string *)&local_418);
                  std::__cxx11::string::~string((string *)&local_418);
                  std::operator+(&local_438,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_3f8,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&pos);
                  std::__cxx11::string::operator=((string *)local_3f8,(string *)&local_438);
                  std::__cxx11::string::~string((string *)&local_438);
                  pcVar3 = (char *)std::__cxx11::string::c_str();
                  bVar2 = cmsys::SystemTools::FileExists(pcVar3);
                  if (bVar2) {
                    i._M_current._7_1_ = 1;
                  }
                  std::__cxx11::string::~string((string *)local_3f8);
                  __gnu_cxx::
                  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator++(&local_3d0);
                }
              }
              if ((i._M_current._7_1_ & 1) == 0) {
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &i_2,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_310,".c");
                std::__cxx11::string::operator=((string *)&pos,(string *)&i_2);
                std::__cxx11::string::~string((string *)&i_2);
                pcVar3 = (char *)std::__cxx11::string::c_str();
                bVar2 = cmsys::SystemTools::FileExists(pcVar3);
                if (bVar2) {
                  i._M_current._7_1_ = 1;
                }
                local_460._M_current =
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::begin(&(this->super_cmMakeDepend).IncludeDirectories);
                while( true ) {
                  path_2.field_2._8_8_ =
                       std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::end(&(this->super_cmMakeDepend).IncludeDirectories);
                  bVar2 = __gnu_cxx::operator!=
                                    (&local_460,
                                     (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                      *)((long)&path_2.field_2 + 8));
                  if (!bVar2) break;
                  pbVar6 = __gnu_cxx::
                           __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           ::operator*(&local_460);
                  std::__cxx11::string::string((string *)local_488,(string *)pbVar6);
                  std::operator+(&local_4a8,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_488,"/");
                  std::__cxx11::string::operator=((string *)local_488,(string *)&local_4a8);
                  std::__cxx11::string::~string((string *)&local_4a8);
                  std::operator+(&local_4c8,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_488,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&pos);
                  std::__cxx11::string::operator=((string *)local_488,(string *)&local_4c8);
                  std::__cxx11::string::~string((string *)&local_4c8);
                  pcVar3 = (char *)std::__cxx11::string::c_str();
                  bVar2 = cmsys::SystemTools::FileExists(pcVar3);
                  if (bVar2) {
                    i._M_current._7_1_ = 1;
                  }
                  std::__cxx11::string::~string((string *)local_488);
                  __gnu_cxx::
                  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator++(&local_460);
                }
              }
              if ((i._M_current._7_1_ & 1) == 0) {
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &i_3,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_310,".txx");
                std::__cxx11::string::operator=((string *)&pos,(string *)&i_3);
                std::__cxx11::string::~string((string *)&i_3);
                pcVar3 = (char *)std::__cxx11::string::c_str();
                bVar2 = cmsys::SystemTools::FileExists(pcVar3);
                if (bVar2) {
                  i._M_current._7_1_ = 1;
                }
                local_4f0._M_current =
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::begin(&(this->super_cmMakeDepend).IncludeDirectories);
                while( true ) {
                  path_3.field_2._8_8_ =
                       std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::end(&(this->super_cmMakeDepend).IncludeDirectories);
                  bVar2 = __gnu_cxx::operator!=
                                    (&local_4f0,
                                     (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                      *)((long)&path_3.field_2 + 8));
                  if (!bVar2) break;
                  pbVar6 = __gnu_cxx::
                           __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           ::operator*(&local_4f0);
                  std::__cxx11::string::string((string *)local_518,(string *)pbVar6);
                  std::operator+(&local_538,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_518,"/");
                  std::__cxx11::string::operator=((string *)local_518,(string *)&local_538);
                  std::__cxx11::string::~string((string *)&local_538);
                  std::operator+(&local_558,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_518,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&pos);
                  std::__cxx11::string::operator=((string *)local_518,(string *)&local_558);
                  std::__cxx11::string::~string((string *)&local_558);
                  pcVar3 = (char *)std::__cxx11::string::c_str();
                  bVar2 = cmsys::SystemTools::FileExists(pcVar3);
                  if (bVar2) {
                    i._M_current._7_1_ = 1;
                  }
                  std::__cxx11::string::~string((string *)local_518);
                  __gnu_cxx::
                  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator++(&local_4f0);
                }
              }
              if ((i._M_current._7_1_ & 1) != 0) {
                uVar5 = std::__cxx11::string::c_str();
                (*(this->super_cmMakeDepend)._vptr_cmMakeDepend[5])(this,info,uVar5);
              }
              std::__cxx11::string::~string((string *)local_310);
            }
            std::__cxx11::string::~string((string *)&pos);
          }
          else if (((this->super_cmMakeDepend).Verbose & 1U) != 0) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      (local_2c0,"Skipping ",(allocator *)(cxxFile.field_2._M_local_buf + 0xf));
            std::allocator<char>::~allocator
                      ((allocator<char> *)(cxxFile.field_2._M_local_buf + 0xf));
            std::__cxx11::string::operator+=(local_2c0,(string *)(message.field_2._M_local_buf + 8))
            ;
            std::__cxx11::string::operator+=(local_2c0," for file ");
            pcVar3 = (char *)std::__cxx11::string::c_str();
            std::__cxx11::string::operator+=(local_2c0,pcVar3);
            pcVar3 = (char *)std::__cxx11::string::c_str();
            cmSystemTools::Error(pcVar3,(char *)0x0,(char *)0x0,(char *)0x0);
            std::__cxx11::string::~string(local_2c0);
          }
          std::__cxx11::string::~string((string *)(message.field_2._M_local_buf + 8));
        }
        std::__cxx11::string::~string((string *)&qstart);
      }
    }
    std::__cxx11::string::~string((string *)(currentline.field_2._M_local_buf + 8));
  }
  else {
    pcVar3 = (char *)std::__cxx11::string::c_str();
    cmSystemTools::Error("error can not open ",pcVar3,(char *)0x0,(char *)0x0);
  }
  std::ifstream::~ifstream(&local_220);
  return;
}

Assistant:

void cmLBDepend::DependWalk(cmDependInformation* info)
{
  cmsys::ifstream fin(info->FullPath.c_str());
  if(!fin)
    {
    cmSystemTools::Error("error can not open ", info->FullPath.c_str());
    return;
    }

  std::string line;
  while(cmSystemTools::GetLineFromStream(fin, line))
    {
    if(cmHasLiteralPrefix(line.c_str(), "#include"))
      {
      // if it is an include line then create a string class
      std::string currentline = line;
      size_t qstart = currentline.find('\"', 8);
      size_t qend;
      // if a quote is not found look for a <
      if(qstart == std::string::npos)
        {
        qstart = currentline.find('<', 8);
        // if a < is not found then move on
        if(qstart == std::string::npos)
          {
          cmSystemTools::Error("unknown include directive ",
                               currentline.c_str() );
          continue;
          }
        else
          {
          qend = currentline.find('>', qstart+1);
          }
        }
      else
        {
        qend = currentline.find('\"', qstart+1);
        }
      // extract the file being included
      std::string includeFile = currentline.substr(qstart+1, qend - qstart-1);
      // see if the include matches the regular expression
      if(!this->IncludeFileRegularExpression.find(includeFile))
        {
        if(this->Verbose)
          {
          std::string message = "Skipping ";
          message += includeFile;
          message += " for file ";
          message += info->FullPath.c_str();
          cmSystemTools::Error(message.c_str(), 0);
          }
        continue;
        }

      // Add this file and all its dependencies.
      this->AddDependency(info, includeFile.c_str());
      /// add the cxx file if it exists
      std::string cxxFile = includeFile;
      std::string::size_type pos = cxxFile.rfind('.');
      if(pos != std::string::npos)
        {
        std::string root = cxxFile.substr(0, pos);
        cxxFile = root + ".cxx";
        bool found = false;
        // try jumping to .cxx .cpp and .c in order
        if(cmSystemTools::FileExists(cxxFile.c_str()))
          {
          found = true;
          }
        for(std::vector<std::string>::iterator i =
              this->IncludeDirectories.begin();
            i != this->IncludeDirectories.end(); ++i)
          {
          std::string path = *i;
          path = path + "/";
          path = path + cxxFile;
          if(cmSystemTools::FileExists(path.c_str()))
            {
            found = true;
            }
          }
        if (!found)
          {
          cxxFile = root + ".cpp";
          if(cmSystemTools::FileExists(cxxFile.c_str()))
            {
            found = true;
            }
          for(std::vector<std::string>::iterator i =
                this->IncludeDirectories.begin();
              i != this->IncludeDirectories.end(); ++i)
            {
            std::string path = *i;
            path = path + "/";
            path = path + cxxFile;
            if(cmSystemTools::FileExists(path.c_str()))
              {
              found = true;
              }
            }
          }
        if (!found)
          {
          cxxFile = root + ".c";
          if(cmSystemTools::FileExists(cxxFile.c_str()))
            {
            found = true;
            }
          for(std::vector<std::string>::iterator i =
                this->IncludeDirectories.begin();
              i != this->IncludeDirectories.end(); ++i)
            {
            std::string path = *i;
            path = path + "/";
            path = path + cxxFile;
            if(cmSystemTools::FileExists(path.c_str()))
              {
              found = true;
              }
            }
          }
        if (!found)
          {
          cxxFile = root + ".txx";
          if(cmSystemTools::FileExists(cxxFile.c_str()))
            {
            found = true;
            }
          for(std::vector<std::string>::iterator i =
                this->IncludeDirectories.begin();
              i != this->IncludeDirectories.end(); ++i)
            {
            std::string path = *i;
            path = path + "/";
            path = path + cxxFile;
            if(cmSystemTools::FileExists(path.c_str()))
              {
              found = true;
              }
            }
          }
        if (found)
          {
          this->AddDependency(info, cxxFile.c_str());
          }
        }
      }
    }
}